

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O0

ssize_t __thiscall
Centaurus::SymbolContext<char>::read_abi_cxx11_
          (SymbolContext<char> *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  allocator local_21;
  char *local_20;
  char *p;
  SymbolContext<char> *this_local;
  
  p = (char *)CONCAT44(in_register_00000034,__fd);
  pcVar2 = (char *)((long)((SymbolContext<char> *)p)->context->m_window +
                   ((SymbolContext<char> *)p)->symbol->start);
  local_20 = pcVar2;
  this_local = this;
  iVar1 = len((SymbolContext<char> *)p);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar2,(long)iVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return (ssize_t)this;
}

Assistant:

std::basic_string<TCHAR> read() const
  {
    const TCHAR *p = reinterpret_cast<const TCHAR *>(context.m_window) + symbol.start;
    return std::basic_string<TCHAR>(p, len());
  }